

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRanging.cpp
# Opt level: O0

void writeRangingFile(FILE *file,HighsLp *lp,double objective_function_value,HighsBasis *basis,
                     HighsSolution *solution,HighsRanging *ranging,HighsInt style)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  uint uVar8;
  size_type sVar9;
  pointer pvVar10;
  ostream *poVar11;
  const_reference pvVar12;
  undefined8 uVar13;
  const_reference pvVar14;
  undefined8 uVar15;
  pointer pvVar16;
  pointer pvVar17;
  pointer pvVar18;
  long in_RCX;
  long in_RDX;
  int *in_RSI;
  FILE *in_RDI;
  byte *in_R8;
  int in_R9D;
  string name_2;
  HighsInt iRow;
  string name_1;
  HighsInt iCol_1;
  string name;
  HighsInt iCol;
  array<char,_32UL> objective;
  array<char,_32UL> up_value;
  array<char,_32UL> dn_value;
  array<char,_32UL> up_objective;
  array<char,_32UL> dn_objective;
  char *raw_bound_format;
  char *pretty_bound_format;
  char *raw_cost_format;
  char *pretty_cost_format;
  bool pretty;
  bool have_row_names;
  bool have_col_names;
  stringstream ss;
  value_type in_stack_fffffffffffff948;
  double in_stack_fffffffffffff950;
  FILE *pFVar19;
  undefined8 in_stack_fffffffffffff958;
  char *pcVar20;
  pointer in_stack_fffffffffffff998;
  pointer in_stack_fffffffffffff9a0;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [36];
  uint local_464;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [36];
  uint local_37c;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  uint local_298;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  byte local_1c3;
  byte local_1c2;
  byte local_1c1;
  stringstream local_1c0 [16];
  ostream local_1b0;
  int local_34;
  byte *local_30;
  long local_28;
  long local_20;
  int *local_10;
  FILE *local_8;
  
  if ((*in_R8 & 1) == 0) {
    fprintf(in_RDI,"None\n");
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    fprintf(in_RDI,"Valid\n");
    std::__cxx11::stringstream::stringstream(local_1c0);
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 0x52));
    local_1c1 = sVar9 != 0;
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 0x58));
    local_1c2 = sVar9 != 0;
    local_1c3 = local_34 == 1;
    local_1d0 = "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g %-10.4g %-s\n";
    local_1d8 = "%-s %s %s %s %s\n";
    local_1e0 = "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-s\n";
    local_1e8 = "%-s %s %s %s %s\n";
    highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
    pFVar19 = local_8;
    pvVar10 = std::array<char,_32UL>::data((array<char,_32UL> *)0x52139d);
    fprintf(pFVar19,"Objective %s\n",pvVar10);
    if ((local_1c3 & 1) == 0) {
      fprintf(local_8,"\n# Cost ranging\n");
    }
    else {
      fprintf(local_8,
              "\n                                            Cost ranging\nColumn Status  DownObj    Down                  Value                 Up         UpObj      Name\n"
             );
    }
    for (local_298 = 0; (int)local_298 < *local_10; local_298 = local_298 + 1) {
      std::__cxx11::string::string(local_2b8);
      std::__cxx11::stringstream::str((string *)local_1c0);
      std::__cxx11::string::~string(local_2b8);
      poVar11 = std::operator<<(&local_1b0,"C");
      std::ostream::operator<<(poVar11,local_298);
      if ((local_1c1 & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_10 + 0x52),(long)(int)local_298);
        std::__cxx11::string::string(local_2d8,(string *)pvVar12);
      }
      pFVar19 = local_8;
      pcVar20 = local_1d0;
      uVar8 = local_298;
      if ((local_1c3 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x80),(long)(int)local_298
                  );
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_1f8 = local_308;
        uStack_1f0 = uStack_300;
        local_208 = local_318;
        uStack_200 = uStack_310;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x20),(long)(int)local_298
                  );
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_218 = local_328;
        uStack_210 = uStack_320;
        local_228 = local_338;
        uStack_220 = uStack_330;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x68),(long)(int)local_298
                  );
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_238 = local_348;
        uStack_230 = uStack_340;
        local_248 = local_358;
        uStack_240 = uStack_350;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 8),(long)(int)local_298);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        pFVar19 = local_8;
        pcVar20 = local_1d8;
        local_268 = local_378;
        local_260 = local_370;
        local_258 = local_368;
        local_250 = local_360;
        uVar13 = std::__cxx11::string::c_str();
        pvVar10 = std::array<char,_32UL>::data((array<char,_32UL> *)0x5218f3);
        pvVar16 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521908);
        pvVar17 = std::array<char,_32UL>::data((array<char,_32UL> *)0x52191d);
        pvVar18 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521932);
        fprintf(pFVar19,pcVar20,uVar13,pvVar10,pvVar16,pvVar17,pvVar18);
      }
      else {
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(local_20 + 0x30),
                   (long)(int)local_298);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)(int)local_298);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)(int)local_298)
        ;
        statusToString_abi_cxx11_
                  ((HighsBasisStatus)((ulong)in_stack_fffffffffffff958 >> 0x38),
                   in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        uVar13 = std::__cxx11::string::c_str();
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x80),
                             (long)(int)local_298);
        vVar1 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x68),
                             (long)(int)local_298);
        vVar2 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_10 + 2),
                             (long)(int)local_298);
        vVar3 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 8),
                             (long)(int)local_298);
        vVar4 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x20),
                             (long)(int)local_298);
        vVar5 = *pvVar14;
        uVar15 = std::__cxx11::string::c_str();
        fprintf(pFVar19,pcVar20,SUB84(vVar1,0),SUB84(vVar2,0),vVar3,vVar4,vVar5,(ulong)uVar8,uVar13,
                uVar15);
        std::__cxx11::string::~string(local_2f8);
      }
      std::__cxx11::string::~string(local_2d8);
    }
    if ((local_1c3 & 1) == 0) {
      fprintf(local_8,"\n# Bound ranging\n# Columns\n");
    }
    else {
      fprintf(local_8,
              "\n                                            Bound ranging\nColumn Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
             );
    }
    for (local_37c = 0; (int)local_37c < *local_10; local_37c = local_37c + 1) {
      std::__cxx11::string::string(local_3a0);
      std::__cxx11::stringstream::str((string *)local_1c0);
      std::__cxx11::string::~string(local_3a0);
      poVar11 = std::operator<<(&local_1b0,"C");
      std::ostream::operator<<(poVar11,local_37c);
      if ((local_1c1 & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_10 + 0x52),(long)(int)local_37c);
        std::__cxx11::string::string(local_3c0,(string *)pvVar12);
      }
      pFVar19 = local_8;
      pcVar20 = local_1e0;
      uVar8 = local_37c;
      if ((local_1c3 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x140),
                   (long)(int)local_37c);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_1f8 = local_3f0;
        uStack_1f0 = uStack_3e8;
        local_208 = local_400;
        uStack_200 = uStack_3f8;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0xe0),(long)(int)local_37c
                  );
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_218 = local_410;
        uStack_210 = uStack_408;
        local_228 = local_420;
        uStack_220 = uStack_418;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x128),
                   (long)(int)local_37c);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_238 = local_430;
        uStack_230 = uStack_428;
        local_248 = local_440;
        uStack_240 = uStack_438;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 200),(long)(int)local_37c)
        ;
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        pFVar19 = local_8;
        pcVar20 = local_1e8;
        local_268 = local_460;
        local_260 = local_458;
        local_258 = local_450;
        local_250 = local_448;
        uVar13 = std::__cxx11::string::c_str();
        in_stack_fffffffffffff998 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521f2a);
        in_stack_fffffffffffff9a0 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521f3f);
        pvVar10 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521f54);
        pvVar16 = std::array<char,_32UL>::data((array<char,_32UL> *)0x521f69);
        fprintf(pFVar19,pcVar20,uVar13,in_stack_fffffffffffff998,in_stack_fffffffffffff9a0,pvVar10,
                pvVar16);
      }
      else {
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(local_20 + 0x30),
                   (long)(int)local_37c);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)(int)local_37c);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)(int)local_37c)
        ;
        statusToString_abi_cxx11_
                  ((HighsBasisStatus)((ulong)in_stack_fffffffffffff958 >> 0x38),
                   in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        uVar13 = std::__cxx11::string::c_str();
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x140),
                             (long)(int)local_37c);
        vVar1 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x128),
                             (long)(int)local_37c);
        vVar2 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                             (long)(int)local_37c);
        vVar3 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_28 + 8),
                             (long)(int)local_37c);
        vVar4 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                             (long)(int)local_37c);
        vVar5 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 200),
                             (long)(int)local_37c);
        vVar6 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0xe0),
                             (long)(int)local_37c);
        vVar7 = *pvVar14;
        uVar15 = std::__cxx11::string::c_str();
        fprintf(pFVar19,pcVar20,SUB84(vVar1,0),SUB84(vVar2,0),vVar3,vVar4,vVar5,vVar6,vVar7,
                (ulong)uVar8,uVar13,uVar15);
        std::__cxx11::string::~string(local_3e0);
      }
      std::__cxx11::string::~string(local_3c0);
    }
    if ((local_1c3 & 1) == 0) {
      fprintf(local_8,"# Rows\n");
    }
    else {
      fprintf(local_8,
              "                                            Bound ranging\n   Row Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
             );
    }
    for (local_464 = 0; (int)local_464 < local_10[1]; local_464 = local_464 + 1) {
      std::__cxx11::string::string(local_488);
      std::__cxx11::stringstream::str((string *)local_1c0);
      std::__cxx11::string::~string(local_488);
      poVar11 = std::operator<<(&local_1b0,"R");
      std::ostream::operator<<(poVar11,local_464);
      if ((local_1c2 & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar12 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_10 + 0x58),(long)(int)local_464);
        std::__cxx11::string::string(local_4a8,(string *)pvVar12);
      }
      uVar8 = local_464;
      if ((local_1c3 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x200),
                   (long)(int)local_464);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_1f8 = local_4d8;
        uStack_1f0 = uStack_4d0;
        local_208 = local_4e8;
        uStack_200 = uStack_4e0;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x1a0),
                   (long)(int)local_464);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_218 = local_4f8;
        uStack_210 = uStack_4f0;
        local_228 = local_508;
        uStack_220 = uStack_500;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x1e8),
                   (long)(int)local_464);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        local_238 = local_518;
        uStack_230 = uStack_510;
        local_248 = local_528;
        uStack_240 = uStack_520;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_30 + 0x188),
                   (long)(int)local_464);
        highsDoubleToString((double)in_stack_fffffffffffff9a0,(double)in_stack_fffffffffffff998);
        pFVar19 = local_8;
        pcVar20 = local_1e8;
        local_268 = local_548;
        local_260 = local_540;
        local_258 = local_538;
        local_250 = local_530;
        uVar13 = std::__cxx11::string::c_str();
        pvVar10 = std::array<char,_32UL>::data((array<char,_32UL> *)0x522523);
        pvVar16 = std::array<char,_32UL>::data((array<char,_32UL> *)0x522535);
        pvVar17 = std::array<char,_32UL>::data((array<char,_32UL> *)0x522547);
        pvVar18 = std::array<char,_32UL>::data((array<char,_32UL> *)0x522559);
        fprintf(pFVar19,pcVar20,uVar13,pvVar10,pvVar16,pvVar17,pvVar18);
      }
      else {
        pFVar19 = local_8;
        pcVar20 = local_1e0;
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(local_20 + 0x48),
                   (long)(int)local_464);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),(long)(int)local_464
                  );
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),(long)(int)local_464
                  );
        statusToString_abi_cxx11_
                  ((HighsBasisStatus)((ulong)pcVar20 >> 0x38),(double)pFVar19,
                   in_stack_fffffffffffff948);
        uVar13 = std::__cxx11::string::c_str();
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x200),
                             (long)(int)local_464);
        vVar1 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x1e8),
                             (long)(int)local_464);
        vVar2 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                             (long)(int)local_464);
        vVar3 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_28 + 0x38),
                             (long)(int)local_464);
        vVar4 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                             (long)(int)local_464);
        vVar5 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x188),
                             (long)(int)local_464);
        vVar6 = *pvVar14;
        pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_30 + 0x1a0),
                             (long)(int)local_464);
        in_stack_fffffffffffff948 = *pvVar14;
        uVar15 = std::__cxx11::string::c_str();
        fprintf(pFVar19,pcVar20,SUB84(vVar1,0),SUB84(vVar2,0),vVar3,vVar4,vVar5,vVar6,
                in_stack_fffffffffffff948,(ulong)uVar8,uVar13,uVar15);
        std::__cxx11::string::~string(local_4c8);
      }
      std::__cxx11::string::~string(local_4a8);
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void writeRangingFile(FILE* file, const HighsLp& lp,
                      const double objective_function_value,
                      const HighsBasis& basis, const HighsSolution& solution,
                      const HighsRanging& ranging, const HighsInt style) {
  if (!ranging.valid) {
    fprintf(file, "None\n");
    return;
  }
  fprintf(file, "Valid\n");
  std::stringstream ss;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool pretty = style == kSolutionStylePretty;
  const char* pretty_cost_format =
      "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g "
      "%-10.4g %-s\n";
  const char* raw_cost_format = "%-s %s %s %s %s\n";

  const char* pretty_bound_format =
      "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g "
      "%-s\n";
  const char* raw_bound_format = "%-s %s %s %s %s\n";

  std::array<char, 32> dn_objective;
  std::array<char, 32> up_objective;
  std::array<char, 32> dn_value;
  std::array<char, 32> up_value;

  auto objective = highsDoubleToString(objective_function_value,
                                       kRangingValueToStringTolerance);
  fprintf(file, "Objective %s\n", objective.data());
  if (pretty) {
    fprintf(file,
            "\n                                            Cost ranging\n"
            "Column Status  DownObj    Down                  Value             "
            "    Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Cost ranging\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_cost_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_cost_dn.objective_[iCol],
              ranging.col_cost_dn.value_[iCol], lp.col_cost_[iCol],
              ranging.col_cost_up.value_[iCol],
              ranging.col_cost_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_cost_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_cost_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_cost_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_cost_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_cost_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
  if (pretty) {
    fprintf(file,
            "\n                                            Bound ranging\n"
            "Column Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Bound ranging\n# Columns\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_bound_dn.objective_[iCol],
              ranging.col_bound_dn.value_[iCol], lp.col_lower_[iCol],
              solution.col_value[iCol], lp.col_upper_[iCol],
              ranging.col_bound_up.value_[iCol],
              ranging.col_bound_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_bound_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_bound_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_bound_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_bound_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }

  if (pretty) {
    fprintf(file,
            "                                            Bound ranging\n"
            "   Row Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "# Rows\n");
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    // Create a row name
    ss.str(std::string());
    ss << "R" << iRow;
    const std::string name = have_row_names ? lp.row_names_[iRow] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iRow,
              statusToString(basis.row_status[iRow], lp.row_lower_[iRow],
                             lp.row_upper_[iRow])
                  .c_str(),
              ranging.row_bound_dn.objective_[iRow],
              ranging.row_bound_dn.value_[iRow], lp.row_lower_[iRow],
              solution.row_value[iRow], lp.row_upper_[iRow],
              ranging.row_bound_up.value_[iRow],
              ranging.row_bound_up.objective_[iRow], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.row_bound_dn.objective_[iRow],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.row_bound_up.objective_[iRow],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.row_bound_dn.value_[iRow],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.row_bound_up.value_[iRow],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
}